

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzer.cpp
# Opt level: O1

AnalyzerChannelData * __thiscall SMBusAnalyzer::GetNearestTransitionChannel(SMBusAnalyzer *this)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  AnalyzerChannelData *pAVar4;
  
  do {
    cVar1 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
    if (cVar1 != '\0') break;
    cVar1 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
  } while (cVar1 == '\0');
  cVar1 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
  if (cVar1 == '\0') {
    AnalyzerChannelData::GetSampleOfNextEdge();
    cVar1 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition
                      ((ulonglong)this->mSMBDAT);
    if (cVar1 == '\0') {
      return this->mSMBCLK;
    }
  }
  cVar1 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
  if (cVar1 == '\0') {
    AnalyzerChannelData::GetSampleOfNextEdge();
    cVar1 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition
                      ((ulonglong)this->mSMBCLK);
    if (cVar1 == '\0') {
      return this->mSMBDAT;
    }
  }
  uVar2 = AnalyzerChannelData::GetSampleOfNextEdge();
  uVar3 = AnalyzerChannelData::GetSampleOfNextEdge();
  if (uVar2 < uVar3) {
    pAVar4 = this->mSMBDAT;
  }
  else {
    pAVar4 = this->mSMBCLK;
  }
  return pAVar4;
}

Assistant:

AnalyzerChannelData* SMBusAnalyzer::GetNearestTransitionChannel()
{
    // if neither channel has more transitions, block for more data.
    while( !mSMBDAT->DoMoreTransitionsExistInCurrentData() && !mSMBCLK->DoMoreTransitionsExistInCurrentData() )
    {
        // DoMoreTransitionsExistInCurrentData will block for up to 250ms waiting for more data, and it will trigger a thread exit if the
        // capture ends and there is still no more data.
    }

    if( !mSMBDAT->DoMoreTransitionsExistInCurrentData() )
    {
        auto next_clk_edge = mSMBCLK->GetSampleOfNextEdge();
        if( !mSMBDAT->WouldAdvancingToAbsPositionCauseTransition( next_clk_edge ) )
        {
            return mSMBCLK;
        }
    }

    if( !mSMBCLK->DoMoreTransitionsExistInCurrentData() )
    {
        auto next_dat_edge = mSMBDAT->GetSampleOfNextEdge();
        if( !mSMBCLK->WouldAdvancingToAbsPositionCauseTransition( next_dat_edge ) )
        {
            return mSMBDAT;
        }
    }

    if( mSMBDAT->GetSampleOfNextEdge() < mSMBCLK->GetSampleOfNextEdge() )
        return mSMBDAT;

    return mSMBCLK;
}